

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

void dxil_spv::emit_buffer_synchronization_validation
               (Impl *impl,CallInst *instruction,BDAOperation bda_operation)

{
  uint uVar1;
  bool bVar2;
  ValueKind VVar3;
  Id type_id;
  RawWidth RVar4;
  Id IVar5;
  Id IVar6;
  Id IVar7;
  Value *pVVar8;
  mapped_type *pmVar9;
  Builder *this;
  Type *pTVar10;
  Constant *this_00;
  APInt *this_01;
  uint64_t uVar11;
  Operation *pOVar12;
  Operation *pOVar13;
  mapped_type *pmVar14;
  LoggingCallback p_Var15;
  void *pvVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  ResourceKind RVar20;
  uint uVar21;
  Id image_id;
  Id local_1060;
  Id local_105c;
  Id local_103c;
  CallInst *local_1038;
  undefined5 uStack_1030;
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  if ((impl->options).instruction_instrumentation.enabled != true) {
    return;
  }
  if ((impl->options).instruction_instrumentation.type != BufferSynchronizationValidation) {
    return;
  }
  pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_103c = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  pmVar9 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&impl->handle_to_resource_meta,&local_103c);
  if ((pmVar9->storage != StorageClassPhysicalStorageBuffer) &&
     ((pmVar9->instrumentation).bda_id == 0)) {
    return;
  }
  this = Converter::Impl::builder(impl);
  if (bda_operation < AtomicRMW) {
    if (bda_operation == Store) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
      pTVar10 = LLVMBC::Value::getType(pVVar8);
    }
    else {
      pTVar10 = LLVMBC::Value::getType((Value *)instruction);
      pTVar10 = LLVMBC::Type::getStructElementType(pTVar10,0);
    }
    RVar20 = pmVar9->kind;
    local_105c = 0;
    IVar6 = 0;
    if ((byte)(RVar20 - RawBuffer) < 2) {
      if (bda_operation == Load) {
        local_1038 = instruction;
        pmVar14 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_composite_meta,(key_type *)&local_1038);
        uVar21 = pmVar14->access_mask & 0xf;
      }
      else {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,8);
        this_00 = (Constant *)LLVMBC::Internal::resolve_proxy(pVVar8);
        VVar3 = LLVMBC::Value::get_value_kind((Value *)this_00);
        if (VVar3 != ConstantInt) {
          p_Var15 = get_thread_log_callback();
          if (p_Var15 == (LoggingCallback)0x0) {
            emit_buffer_synchronization_validation();
            std::terminate();
          }
          uStack_1028 = 0x6163206e69;
          builtin_strncpy(acStack_1023,"st<T>.\n",8);
          local_1038 = (CallInst *)0x2064696c61766e49;
          uStack_1030 = 0x2065707974;
          uStack_102b = 0x204449;
          pvVar16 = get_thread_log_callback_userdata();
          (*p_Var15)(pvVar16,Error,(char *)&local_1038);
          std::terminate();
        }
        this_01 = LLVMBC::Constant::getUniqueInteger(this_00);
        uVar11 = LLVMBC::APInt::getZExtValue(this_01);
        uVar21 = (uint)uVar11;
      }
      uVar18._0_1_ = (impl->execution_mode_meta).native_16bit_operations;
      uVar18._1_1_ = (impl->execution_mode_meta).synthesize_2d_quad_dispatch;
      uVar18._2_1_ = (impl->execution_mode_meta).synthesize_dummy_derivatives;
      uVar18._3_1_ = (impl->execution_mode_meta).field_0x33;
      RVar4 = get_buffer_access_bits_per_component((Impl *)(ulong)uVar18,pmVar9->storage,pTVar10);
      uVar18 = 0;
      uVar19 = 0;
      do {
        uVar1 = uVar18 & 0x1f;
        uVar18 = uVar18 + 1;
        if ((uVar21 >> uVar1 & 1) != 0) {
          uVar19 = uVar18;
        }
      } while (uVar18 != 4);
      bVar17 = 6;
      if (RVar4 != B64) {
        bVar17 = RVar4 == B16 ^ 5;
      }
      IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar6 = spv::Builder::makeIntConstant(this,IVar5,(uVar19 << bVar17) >> 3,false);
      RVar20 = pmVar9->kind;
    }
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
    IVar7 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    if (RVar20 == TypedBuffer) {
      IVar5 = (pmVar9->instrumentation).elem_size_id;
      local_1060 = 0;
      IVar6 = IVar5;
      local_105c = IVar7;
    }
    else {
      if (RVar20 == RawBuffer) goto LAB_00172b8a;
      if (RVar20 == StructuredBuffer) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
        pVVar8 = LLVMBC::Internal::resolve_proxy(pVVar8);
        VVar3 = LLVMBC::Value::get_value_kind(pVVar8);
        local_1060 = 0;
        if (VVar3 != Undef) {
          pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,3);
          local_1060 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
        }
        uVar21 = pmVar9->stride;
        IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar5 = spv::Builder::makeIntConstant(this,IVar5,uVar21,false);
        local_105c = IVar7;
      }
      else {
        local_1060 = 0;
        IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
        IVar5 = spv::Builder::makeIntConstant(this,IVar5,0x10,false);
        IVar6 = IVar5;
        local_105c = IVar7;
      }
    }
  }
  else {
    bVar2 = value_is_dx_op_instrinsic((Value *)instruction,AtomicCompareExchange);
    uVar21 = bVar2 ^ 3;
    RVar20 = pmVar9->kind;
    if (RVar20 == TypedBuffer) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar21);
      local_1060 = 0;
      local_105c = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      IVar5 = (pmVar9->instrumentation).elem_size_id;
    }
    else if (RVar20 == StructuredBuffer) {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar21);
      local_1060 = 0;
      local_105c = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar21 + 1);
      pVVar8 = LLVMBC::Internal::resolve_proxy(pVVar8);
      VVar3 = LLVMBC::Value::get_value_kind(pVVar8);
      if (VVar3 != Undef) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar21 + 1);
        local_1060 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      }
      uVar21 = pmVar9->stride;
      IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
      IVar5 = spv::Builder::makeIntConstant(this,IVar5,uVar21,false);
    }
    else {
      local_105c = 0;
      local_1060 = 0;
      IVar5 = 0;
      if (RVar20 == RawBuffer) {
        pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar21);
        local_105c = 0;
        local_1060 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
        IVar5 = 0;
      }
    }
    pTVar10 = LLVMBC::Value::getType((Value *)instruction);
    uVar21 = LLVMBC::Type::getIntegerBitWidth(pTVar10);
    IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar6 = spv::Builder::makeIntConstant(this,IVar6,uVar21 >> 3,false);
  }
  IVar7 = local_1060;
  if (local_105c == 0) {
    local_105c = 0;
  }
  else {
    type_id = spv::Builder::makeIntegerType(this,0x20,false);
    pOVar12 = Converter::Impl::allocate(impl,OpIMul,type_id);
    Operation::add_id(pOVar12,local_105c);
    Operation::add_id(pOVar12,IVar5);
    Converter::Impl::add(impl,pOVar12,false);
    IVar5 = pOVar12->id;
    if ((IVar5 != 0) && (IVar7 = IVar5, local_1060 != 0)) {
      IVar7 = spv::Builder::makeIntegerType(this,0x20,false);
      pOVar12 = Converter::Impl::allocate(impl,OpIAdd,IVar7);
      Operation::add_id(pOVar12,IVar5);
      Operation::add_id(pOVar12,local_1060);
      Converter::Impl::add(impl,pOVar12,false);
      IVar7 = pOVar12->id;
    }
  }
LAB_00172b8a:
  local_1060 = IVar7;
  IVar5 = SPIRVModule::get_helper_call_id(impl->spirv_module,ValidateBDALoadStore,0);
  IVar7 = spv::Builder::makeBoolType(this);
  pOVar12 = Converter::Impl::allocate(impl,OpFunctionCall,IVar7);
  Operation::add_id(pOVar12,IVar5);
  IVar5 = (pmVar9->instrumentation).bda_id;
  if (IVar5 == 0) {
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
  }
  Operation::add_id(pOVar12,IVar5);
  Operation::add_id(pOVar12,local_1060);
  Operation::add_id(pOVar12,IVar6);
  IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
  IVar5 = spv::Builder::makeIntConstant(this,IVar5,bda_operation,false);
  Operation::add_id(pOVar12,IVar5);
  IVar5 = spv::Builder::makeIntegerType(this,0x20,false);
  pOVar13 = Converter::Impl::allocate(impl,OpLoad,IVar5);
  Operation::add_id(pOVar13,(impl->instrumentation).invocation_id_var_id);
  Converter::Impl::add(impl,pOVar13,false);
  Operation::add_id(pOVar12,pOVar13->id);
  if ((pmVar9->instrumentation).resource_size_id == 0) {
    IVar5 = spv::Builder::makeBoolConstant(this,true,false);
  }
  else {
    IVar5 = spv::Builder::makeBoolType(this);
    pOVar13 = Converter::Impl::allocate(impl,OpULessThan,IVar5);
    if (pmVar9->kind == TypedBuffer) {
      local_1060 = local_105c;
    }
    Operation::add_id(pOVar13,local_1060);
    Operation::add_id(pOVar13,(pmVar9->instrumentation).resource_size_id);
    Converter::Impl::add(impl,pOVar13,false);
    IVar5 = pOVar13->id;
  }
  Operation::add_id(pOVar12,IVar5);
  Converter::Impl::add(impl,pOVar12,false);
  pOVar13 = Converter::Impl::allocate(impl,OpAssumeTrueKHR);
  Operation::add_id(pOVar13,pOVar12->id);
  Converter::Impl::add(impl,pOVar13,false);
  return;
}

Assistant:

void emit_buffer_synchronization_validation(Converter::Impl &impl,
                                            const llvm::CallInst *instruction,
                                            BDAOperation bda_operation)
{
	if (!impl.options.instruction_instrumentation.enabled ||
	    impl.options.instruction_instrumentation.type != InstructionInstrumentationType::BufferSynchronizationValidation)
	{
		return;
	}

	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	const auto &meta = impl.handle_to_resource_meta[image_id];

	if (meta.storage != spv::StorageClassPhysicalStorageBuffer && meta.instrumentation.bda_id == 0)
		return;

	auto &builder = impl.builder();
	spv::Id stride_id = 0;
	spv::Id offset_id = 0;
	spv::Id elem_id = 0;
	spv::Id len_id = 0;

	if (bda_operation == BDAOperation::Store || bda_operation == BDAOperation::Load)
	{
		const llvm::Type *element_type;
		if (bda_operation == BDAOperation::Store)
			element_type = instruction->getOperand(4)->getType();
		else
			element_type = instruction->getType()->getStructElementType(0);

		if (meta.kind == DXIL::ResourceKind::RawBuffer || meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			unsigned mask;

			if (bda_operation == BDAOperation::Load)
			{
				auto &access_meta = impl.llvm_composite_meta[instruction];
				mask = access_meta.access_mask & 0xf;
			}
			else
			{
				mask = llvm::cast<llvm::ConstantInt>(instruction->getOperand(8))->getUniqueInteger().getZExtValue();
			}

			unsigned width = raw_width_to_bits(get_buffer_access_bits_per_component(impl, meta.storage, element_type));

			unsigned num_elems = 0;
			for (unsigned i = 0; i < 4; i++)
				if ((mask & (1u << i)) != 0)
					num_elems = i + 1;

			len_id = builder.makeUintConstant(num_elems * width / 8);
		}

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(2));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(3)))
				offset_id = impl.get_id_for_value(instruction->getOperand(3));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = meta.instrumentation.elem_size_id;
			len_id = meta.instrumentation.elem_size_id;
		}
		else
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(2));
			stride_id = builder.makeUintConstant(16);
			len_id = stride_id;
		}
	}
	else
	{
		unsigned elem_index;

		if (value_is_dx_op_instrinsic(instruction, DXIL::Op::AtomicCompareExchange))
			elem_index = 2;
		else
			elem_index = 3;

		if (meta.kind == DXIL::ResourceKind::RawBuffer)
		{
			offset_id = impl.get_id_for_value(instruction->getOperand(elem_index));
		}
		else if (meta.kind == DXIL::ResourceKind::StructuredBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			if (!llvm::isa<llvm::UndefValue>(instruction->getOperand(elem_index + 1)))
				offset_id = impl.get_id_for_value(instruction->getOperand(elem_index + 1));
			stride_id = builder.makeUintConstant(meta.stride);
		}
		else if (meta.kind == DXIL::ResourceKind::TypedBuffer)
		{
			elem_id = impl.get_id_for_value(instruction->getOperand(elem_index));
			stride_id = meta.instrumentation.elem_size_id;
		}

		len_id = builder.makeUintConstant(instruction->getType()->getIntegerBitWidth() / 8);
	}

	spv::Id total_offset_id = 0;

	if (elem_id != 0)
	{
		auto *mul = impl.allocate(spv::OpIMul, builder.makeUintType(32));
		mul->add_id(elem_id);
		mul->add_id(stride_id);
		impl.add(mul);
		total_offset_id = mul->id;
	}

	if (!total_offset_id)
	{
		total_offset_id = offset_id;
	}
	else if (offset_id != 0)
	{
		auto *add = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
		add->add_id(total_offset_id);
		add->add_id(offset_id);
		impl.add(add);
		total_offset_id = add->id;
	}

	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::ValidateBDALoadStore);
	auto *call = impl.allocate(spv::OpFunctionCall, builder.makeBoolType());
	call->add_id(call_id);
	call->add_id(meta.instrumentation.bda_id ? meta.instrumentation.bda_id : impl.get_id_for_value(instruction->getOperand(1)));
	call->add_id(total_offset_id);
	call->add_id(len_id);
	call->add_id(builder.makeUintConstant(unsigned(bda_operation)));

	auto *load_invocation_id = impl.allocate(spv::OpLoad, builder.makeUintType(32));
	load_invocation_id->add_id(impl.instrumentation.invocation_id_var_id);
	impl.add(load_invocation_id);

	call->add_id(load_invocation_id->id);

	if (meta.instrumentation.resource_size_id)
	{
		auto *in_bounds = impl.allocate(spv::OpULessThan, builder.makeBoolType());

		if (meta.kind == DXIL::ResourceKind::TypedBuffer)
			in_bounds->add_id(elem_id);
		else
			in_bounds->add_id(total_offset_id);
		in_bounds->add_id(meta.instrumentation.resource_size_id);

		impl.add(in_bounds);
		call->add_id(in_bounds->id);
	}
	else
	{
		call->add_id(builder.makeBoolConstant(true));
	}

	impl.add(call);

	auto *expect_true = impl.allocate(spv::OpAssumeTrueKHR);
	expect_true->add_id(call->id);
	impl.add(expect_true);
}